

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adj_matrix_graph.c
# Opt level: O0

MatrixGraph createUDG(Vertices vertex,Edges edge,int countOfVertex,int countOfEdge)

{
  int local_34;
  int i;
  MatrixGraph matrixGraph;
  int countOfEdge_local;
  int countOfVertex_local;
  Edges edge_local;
  Vertices vertex_local;
  
  if (countOfVertex < 1) {
    vertex_local = (Vertices)0x0;
  }
  else {
    vertex_local = (Vertices)newEmptyMatrixGraph(countOfVertex,countOfEdge);
    ((MatrixGraph)vertex_local)->kind = UDG;
    putVertexIntoMatrix((MatrixGraph)vertex_local,vertex,countOfVertex);
    for (local_34 = 0; local_34 < countOfEdge; local_34 = local_34 + 1) {
      ((MatrixGraph)vertex_local)->matrix[edge[local_34].vi][edge[local_34].vj] = 1;
      ((MatrixGraph)vertex_local)->matrix[edge[local_34].vj][edge[local_34].vi] = 1;
    }
  }
  return (MatrixGraph)vertex_local;
}

Assistant:

MatrixGraph createUDG(Vertices vertex, Edges edge, int countOfVertex, int countOfEdge) {
    if (countOfVertex <= 0) return NULL;
    MatrixGraph matrixGraph = newEmptyMatrixGraph(countOfVertex, countOfEdge);
    matrixGraph->kind = UDG;
    putVertexIntoMatrix(matrixGraph, vertex, countOfVertex);

    // 构建矩阵
    for (int i = 0; i < countOfEdge; ++i) {
        matrixGraph->matrix[edge[i].vi][edge[i].vj] = 1;
        matrixGraph->matrix[edge[i].vj][edge[i].vi] = 1;
    }

    return matrixGraph;
}